

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void MatrixPrint(Matrix *a)

{
  char *pcVar1;
  uint local_18;
  uint local_14;
  uint32_t col;
  uint32_t row;
  Matrix *a_local;
  
  printf("{");
  for (local_14 = 0; local_14 < a->rows; local_14 = local_14 + 1) {
    printf("{");
    for (local_18 = 0; local_18 < a->columns; local_18 = local_18 + 1) {
      pcVar1 = "%Lf";
      if (local_18 < a->columns - 1) {
        pcVar1 = "%Lf,";
      }
      MatrixGetElement((Real *)a,(Matrix *)(ulong)local_14,local_18,0x10d374);
      printf(pcVar1);
    }
    pcVar1 = "}";
    if (local_14 < a->rows - 1) {
      pcVar1 = "},";
    }
    printf("%s",pcVar1);
  }
  printf("}\n");
  return;
}

Assistant:

void MatrixPrint(const Matrix *a) {
  printf("{");
  for (uint32_t row = 0; row < a->rows; ++row) {
    printf("{");
    for (uint32_t col = 0; col < a->columns; ++col) {
      printf(col < a->columns - 1 ? "%Lf," : "%Lf", MatrixGetElement(a, row, col));
    }
    printf("%s", row < a->rows - 1 ? "}," : "}");
  }
  printf("}\n");
}